

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandDsdMerge(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  FILE *__stream;
  If_DsdMan_t *pNew;
  If_DsdMan_t *p;
  char *pcVar4;
  int level;
  
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if (iVar1 == -1) {
    iVar1 = 0;
    pvVar2 = Abc_FrameReadManDsd();
    if (pvVar2 == (void *)0x0) {
      pcVar4 = "The DSD manager is not started.\n";
      level = -1;
      goto LAB_0020dc51;
    }
    if (argc - globalUtilOptind == 1) {
      pcVar4 = argv[globalUtilOptind];
      pcVar3 = pcVar4;
      do {
        if (*pcVar3 == '>') {
          *pcVar3 = '\\';
        }
        else if (*pcVar3 == '\0') goto LAB_0020dba3;
        pcVar3 = pcVar3 + 1;
      } while( true );
    }
    pcVar4 = "File name is not given on the command line.\n";
    iVar1 = -1;
  }
  else {
    Abc_Print(-2,"usage: dsd_merge [-h] <file>\n");
    Abc_Print(-2,"\t         merges DSD manager from file with the current one\n");
    Abc_Print(-2,"\t-h     : print the command usage\n");
    pcVar4 = "\t<file> : file name to read\n";
    iVar1 = -2;
  }
  Abc_Print(iVar1,pcVar4);
  return 1;
LAB_0020dba3:
  __stream = fopen(pcVar4,"r");
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
    pNew = If_DsdManLoad(pcVar4);
    if (pNew == (If_DsdMan_t *)0x0) {
      return 1;
    }
    p = (If_DsdMan_t *)Abc_FrameReadManDsd();
    If_DsdManMerge(p,pNew);
    If_DsdManFree(pNew,0);
    return 0;
  }
  Abc_Print(-1,"Cannot open input file \"%s\". ",pcVar4);
  pcVar4 = Extra_FileGetSimilarName(pcVar4,".aig",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  if (pcVar4 != (char *)0x0) {
    Abc_Print(1,"Did you mean \"%s\"?",pcVar4);
  }
  pcVar4 = "\n";
  iVar1 = 1;
  level = 1;
LAB_0020dc51:
  Abc_Print(level,pcVar4);
  return iVar1;
}

Assistant:

int Abc_CommandDsdMerge( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    char * FileName, * pTemp;
    char ** pArgvNew;
    int c, nArgcNew;
    FILE * pFile;
    If_DsdMan_t * pDsdMan;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( !Abc_FrameReadManDsd() )
    {
        Abc_Print( -1, "The DSD manager is not started.\n" );
        return 0;
    }
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        Abc_Print( -1, "File name is not given on the command line.\n" );
        return 1;
    }
    // get the input file name
    FileName = pArgvNew[0];
    // fix the wrong symbol
    for ( pTemp = FileName; *pTemp; pTemp++ )
        if ( *pTemp == '>' )
            *pTemp = '\\';
    if ( (pFile = fopen( FileName, "r" )) == NULL )
    {
        Abc_Print( -1, "Cannot open input file \"%s\". ", FileName );
        if ( (FileName = Extra_FileGetSimilarName( FileName, ".aig", NULL, NULL, NULL, NULL )) )
            Abc_Print( 1, "Did you mean \"%s\"?", FileName );
        Abc_Print( 1, "\n" );
        return 1;
    }
    fclose( pFile );
    pDsdMan = If_DsdManLoad(FileName);
    if ( pDsdMan == NULL )
        return 1;
    If_DsdManMerge( (If_DsdMan_t *)Abc_FrameReadManDsd(), pDsdMan );
    If_DsdManFree( pDsdMan, 0 );
    return 0;

usage:
    Abc_Print( -2, "usage: dsd_merge [-h] <file>\n" );
    Abc_Print( -2, "\t         merges DSD manager from file with the current one\n");
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : file name to read\n");
    return 1;
}